

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

void Curl_ssl_easy_config_init(Curl_easy *data)

{
  undefined1 *puVar1;
  
  puVar1 = &(data->set).ssl.primary.field_0x81;
  *puVar1 = *puVar1 | 0xb;
  memcpy(&(data->set).proxy_ssl,&(data->set).ssl,0xd0);
  return;
}

Assistant:

void Curl_ssl_easy_config_init(struct Curl_easy *data)
{
  /*
   * libcurl 7.10 introduced SSL verification *by default*! This needs to be
   * switched off unless wanted.
   */
  data->set.ssl.primary.verifypeer = TRUE;
  data->set.ssl.primary.verifyhost = TRUE;
  data->set.ssl.primary.cache_session = TRUE; /* caching by default */
#ifndef CURL_DISABLE_PROXY
  data->set.proxy_ssl = data->set.ssl;
#endif
}